

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O0

int codebook_decode_start(vorb *f,Codebook *c)

{
  byte bVar1;
  int local_24;
  int n;
  int z;
  Codebook *c_local;
  vorb *f_local;
  
  local_24 = -1;
  if (c->lookup_type == '\0') {
    error(f,VORBIS_invalid_stream);
  }
  else {
    if (f->valid_bits < 10) {
      prep_huffman(f);
    }
    local_24 = (int)c->fast_huffman[(int)(f->acc & 0x3ff)];
    if (local_24 < 0) {
      local_24 = codebook_decode_scalar_raw(f,c);
    }
    else {
      bVar1 = c->codeword_lengths[local_24];
      f->acc = f->acc >> (bVar1 & 0x1f);
      f->valid_bits = f->valid_bits - (uint)bVar1;
      if (f->valid_bits < 0) {
        f->valid_bits = 0;
        local_24 = -1;
      }
    }
    if ((c->sparse != '\0') && (c->sorted_entries <= local_24)) {
      __assert_fail("z < c->sorted_entries",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/stb/stb_vorbis.h"
                    ,0x6e9,"int codebook_decode_start(vorb *, Codebook *)");
    }
    if (local_24 < 0) {
      if ((f->bytes_in_seg == '\0') && (f->last_seg != 0)) {
        return local_24;
      }
      error(f,VORBIS_invalid_stream);
    }
  }
  return local_24;
}

Assistant:

static int codebook_decode_start(vorb *f, Codebook *c)
{
   int z = -1;

   // type 0 is only legal in a scalar context
   if (c->lookup_type == 0)
      error(f, VORBIS_invalid_stream);
   else {
      DECODE_VQ(z,f,c);
      if (c->sparse) assert(z < c->sorted_entries);
      if (z < 0) {  // check for EOP
         if (!f->bytes_in_seg)
            if (f->last_seg)
               return z;
         error(f, VORBIS_invalid_stream);
      }
   }
   return z;
}